

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int mbedtls_asn1_get_alg_null(uchar **p,uchar *end,mbedtls_asn1_buf *alg)

{
  mbedtls_asn1_buf params;
  int ret;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  mbedtls_asn1_buf *in_stack_ffffffffffffffc8;
  uchar *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  int local_4;
  
  uVar1 = 0xffffff92;
  memset(&stack0xffffffffffffffc0,0,0x18);
  local_4 = mbedtls_asn1_get_alg
                      ((uchar **)CONCAT44(uVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0
                       ,in_stack_ffffffffffffffc8,
                       (mbedtls_asn1_buf *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (local_4 == 0) {
    if (((in_stack_ffffffffffffffc0 == 5) || (in_stack_ffffffffffffffc0 == 0)) &&
       (in_stack_ffffffffffffffc8 == (mbedtls_asn1_buf *)0x0)) {
      local_4 = 0;
    }
    else {
      local_4 = -0x68;
    }
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_get_alg_null(unsigned char **p,
                              const unsigned char *end,
                              mbedtls_asn1_buf *alg)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf params;

    memset(&params, 0, sizeof(mbedtls_asn1_buf));

    if ((ret = mbedtls_asn1_get_alg(p, end, alg, &params)) != 0) {
        return ret;
    }

    if ((params.tag != MBEDTLS_ASN1_NULL && params.tag != 0) || params.len != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }

    return 0;
}